

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Interpolater.cpp
# Opt level: O0

void __thiscall
amrex::FaceLinear::interp_arr
          (FaceLinear *this,Array<FArrayBox_*,_3> *crse,int crse_comp,Array<FArrayBox_*,_3> *fine,
          int fine_comp,int ncomp,Box *fine_region,IntVect *ratio,Array<IArrayBox_*,_3> *solve_mask,
          Geometry *param_10,Geometry *param_11,
          Vector<std::array<amrex::BCRec,_3UL>,_std::allocator<std::array<amrex::BCRec,_3UL>_>_>
          *param_12,int param_13,int param_14,RunOn runon)

{
  uint uVar1;
  undefined8 uVar2;
  double dVar3;
  long lVar4;
  int iVar21;
  undefined8 uVar5;
  int iVar6;
  int iVar22;
  int iVar23;
  undefined8 uVar7;
  int iVar24;
  int iVar8;
  int iVar9;
  int iVar10;
  bool bVar11;
  uint uVar12;
  const_reference ppFVar13;
  const_reference ppIVar14;
  reference pvVar15;
  byte bVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  long lVar20;
  int in_EDX;
  int in_R8D;
  int in_R9D;
  undefined8 *in_stack_00000008;
  int *in_stack_00000010;
  int n_5;
  int i_5;
  int j_5;
  int k_5;
  Dim3 amrex_i_hi_5;
  Dim3 amrex_i_lo_5;
  int n_4;
  int i_4;
  int j_4;
  int k_4;
  Dim3 amrex_i_hi_4;
  Dim3 amrex_i_lo_4;
  int n_3;
  int i_3;
  int j_3;
  int k_3;
  Dim3 amrex_i_hi_3;
  Dim3 amrex_i_lo_3;
  Box bx2_1;
  Box bx1_1;
  Box bx0_1;
  int n_2;
  int i_2;
  int j_2;
  int k_2;
  Dim3 amrex_i_hi_2;
  Dim3 amrex_i_lo_2;
  int n_1;
  int i_1;
  int j_1;
  int k_1;
  Dim3 amrex_i_hi_1;
  Dim3 amrex_i_lo_1;
  int n;
  int i;
  int j;
  int k;
  Dim3 amrex_i_hi;
  Dim3 amrex_i_lo;
  Box bx2;
  Box bx1;
  Box bx0;
  int d_1;
  GpuArray<amrex::Array4<const_int>,_3U> mask_arr;
  GpuArray<amrex::Array4<double>,_3U> fine_arr;
  GpuArray<amrex::Array4<const_double>,_3U> crse_arr;
  int d;
  Array<IndexType,_3> types;
  int ck;
  int cj;
  int ci;
  int ck_1;
  int ci_1;
  int cj_1;
  int cj_2;
  int ci_2;
  int ck_2;
  int i2;
  int i1;
  Real w;
  int ci_3;
  int j2;
  int j1;
  Real w_1;
  int cj_3;
  int k2;
  int k1;
  Real w_2;
  int ck_3;
  int off;
  uint bitval;
  uint typ;
  int dir;
  int off_1;
  uint bitval_1;
  uint typ_1;
  int dir_1;
  int off_2;
  uint bitval_2;
  uint typ_2;
  int dir_2;
  int off_3;
  uint bitval_3;
  uint typ_3;
  int dir_3;
  int off_4;
  uint bitval_4;
  uint typ_4;
  int dir_4;
  int off_5;
  uint bitval_5;
  uint typ_5;
  int dir_5;
  size_type in_stack_ffffffffffffe5e8;
  undefined4 in_stack_ffffffffffffe5f0;
  undefined4 in_stack_ffffffffffffe5f4;
  int local_1a08;
  undefined4 in_stack_ffffffffffffe600;
  undefined4 in_stack_ffffffffffffe604;
  long local_19f8;
  int local_19f0;
  int local_19ec;
  int local_19e8;
  int local_1998;
  int local_1994;
  int local_1990;
  int local_1988;
  int local_1984;
  int local_1980;
  int local_1978;
  int local_1974;
  int local_1970;
  int local_1968;
  int local_1964;
  int local_1960;
  int local_1958;
  int local_1954;
  int local_1950;
  int local_1948;
  int local_1944;
  int local_1940;
  int local_1938;
  int local_1934;
  int local_1930;
  int local_1928;
  int local_1924;
  int local_1920;
  int local_1918;
  int local_1914;
  int local_1910;
  int local_18b8;
  int local_18b4;
  int local_18b0;
  int local_18ac;
  int local_1868;
  int local_1864;
  undefined8 local_1860;
  int local_1818;
  int local_1814;
  undefined8 local_1810;
  int local_17cc;
  int iStack_17c8;
  int local_17c4;
  int aiStack_17c0 [4];
  undefined1 local_17b0 [8];
  int local_17a8;
  int iStack_17a4;
  undefined8 local_17a0;
  uint local_1798;
  undefined1 local_1794 [8];
  int local_178c;
  int iStack_1788;
  undefined8 local_1784;
  uint local_177c;
  int local_1778;
  int local_1774;
  int local_1770;
  int local_176c;
  undefined8 local_1768;
  int local_1760;
  undefined8 local_1754;
  int local_174c;
  int local_1748;
  int iStack_1744;
  int local_1740;
  int local_1738;
  int iStack_1734;
  int local_1730;
  int local_1728;
  int local_1724;
  int local_1720;
  int local_171c;
  undefined8 local_1718;
  int local_1710;
  undefined8 local_1704;
  int local_16fc;
  int local_16f8;
  int iStack_16f4;
  int local_16f0;
  int local_16e8;
  int iStack_16e4;
  int local_16e0;
  int local_16d8;
  int local_16d4;
  int local_16d0;
  int local_16cc;
  undefined8 local_16c8;
  int local_16c0;
  undefined8 local_16b4;
  int local_16ac;
  int local_16a8;
  int iStack_16a4;
  int local_16a0;
  int local_1698;
  int iStack_1694;
  int local_1690;
  undefined8 local_168c;
  int local_1684;
  int iStack_1680;
  undefined8 local_167c;
  uint local_1674;
  undefined8 local_1670;
  int local_1668;
  int iStack_1664;
  undefined8 local_1660;
  uint local_1658;
  undefined8 local_1654;
  int local_164c;
  int iStack_1648;
  undefined8 local_1644;
  uint local_163c;
  Array4<const_int> local_1638;
  Array4<double> local_15f8;
  Array4<const_double> local_15b8;
  int local_1574;
  Array4 local_1570 [64];
  Array4 local_1530 [64];
  Array4 local_14f0 [64];
  long local_14b0 [4];
  int iStack_1490;
  int iStack_148c;
  int iStack_1488;
  long local_1470;
  long local_1468;
  long local_1460;
  long local_1458;
  int local_1450;
  int local_144c;
  int local_1448;
  long local_1430;
  long local_1428;
  long local_1420;
  long local_1418;
  int local_1410;
  int local_140c;
  int local_1408;
  long local_13f0;
  Long aLStack_13e8 [4];
  undefined1 auStack_13c8 [24];
  long local_13b0 [8];
  long local_1370 [8];
  int local_1330;
  int local_1320;
  int local_131c;
  int local_130c;
  undefined1 *local_12f8;
  undefined1 *local_12f0;
  Array4<double> local_12e8;
  int local_12a4;
  value_type local_12a0;
  Array4<const_double> local_1298;
  int local_1254;
  value_type local_1250;
  int local_1244;
  reference local_1240;
  undefined4 local_1234;
  long *local_1230;
  undefined4 local_1224;
  long *local_1220;
  undefined4 local_1214;
  long *local_1210;
  int local_1204;
  long *local_1200;
  undefined4 local_11c4;
  long *local_11c0;
  undefined4 local_11b4;
  long *local_11b0;
  undefined4 local_11a4;
  long *local_11a0;
  int local_1194;
  long *local_1190;
  Array4<const_int> local_1188;
  int local_1144;
  value_type local_1140;
  undefined4 local_1134;
  Array4 *local_1130;
  undefined4 local_1124;
  Array4 *local_1120;
  undefined4 local_1114;
  Array4 *local_1110;
  int local_1104;
  Array4 *local_1100;
  uint local_10dc;
  reference local_10d8;
  uint local_10c4;
  reference local_10c0;
  uint local_10ac;
  reference local_10a8;
  uint local_1094;
  reference local_1090;
  uint local_107c;
  reference local_1078;
  int local_ff0;
  int iStack_fec;
  int local_fe8;
  undefined8 *local_fe0;
  int local_fd4;
  int iStack_fd0;
  int local_fcc;
  int local_fc8;
  int iStack_fc4;
  int local_fc0;
  undefined8 *local_fb8;
  int local_fac;
  int iStack_fa8;
  int local_fa4;
  int local_fa0;
  int iStack_f9c;
  int local_f98;
  undefined8 *local_f90;
  int local_f84;
  int iStack_f80;
  int local_f7c;
  undefined8 local_f00;
  int local_ef8;
  undefined8 *local_ef0;
  int local_ee4;
  undefined8 uStack_ee0;
  undefined8 local_ed8;
  int local_ed0;
  undefined8 *local_ec8;
  int local_ebc;
  undefined8 uStack_eb8;
  undefined8 local_eb0;
  int local_ea8;
  undefined8 *local_ea0;
  int local_e98;
  undefined8 uStack_e94;
  int local_e8c;
  int local_e88;
  int local_e84;
  int *local_e80;
  Array4 *local_e78;
  long *local_e70;
  long *local_e68;
  int local_e5c;
  int local_e58;
  int local_e54;
  int local_e50;
  int local_e4c;
  int local_e48;
  int local_e44;
  int *local_e40;
  Array4 *local_e38;
  long *local_e30;
  long *local_e28;
  int local_e1c;
  int local_e18;
  int local_e14;
  int local_e10;
  int local_e0c;
  int local_e08;
  int local_e04;
  int *local_e00;
  Array4 *local_df8;
  long *local_df0;
  long *local_de8;
  int local_de0;
  int local_ddc;
  int local_dd8;
  int local_dd4;
  undefined4 local_c04;
  int *local_c00;
  undefined4 local_bf4;
  int *local_bf0;
  undefined4 local_be4;
  int *local_be0;
  undefined4 local_bd4;
  int *local_bd0;
  undefined4 local_bc4;
  int *local_bc0;
  undefined4 local_bb4;
  int *local_bb0;
  undefined4 local_ba4;
  int *local_ba0;
  undefined4 local_b94;
  int *local_b90;
  undefined4 local_b84;
  int *local_b80;
  undefined4 local_b74;
  int *local_b70;
  undefined4 local_b64;
  int *local_b60;
  undefined4 local_b54;
  int *local_b50;
  undefined4 local_b44;
  int *local_b40;
  undefined4 local_b34;
  int *local_b30;
  undefined4 local_b24;
  int *local_b20;
  undefined4 local_b14;
  int *local_b10;
  undefined4 local_b04;
  int *local_b00;
  undefined4 local_af4;
  int *local_af0;
  undefined4 local_ae4;
  int *local_ae0;
  undefined4 local_ad4;
  int *local_ad0;
  undefined4 local_ac4;
  int *local_ac0;
  undefined4 local_a24;
  undefined8 *local_a20;
  undefined4 local_a14;
  undefined8 *local_a10;
  undefined4 local_a04;
  undefined8 *local_a00;
  undefined4 local_9f4;
  undefined8 *local_9f0;
  undefined4 local_9e4;
  undefined8 *local_9e0;
  undefined4 local_9d4;
  undefined8 *local_9d0;
  undefined4 local_9c4;
  undefined8 *local_9c0;
  undefined4 local_9b4;
  undefined8 *local_9b0;
  undefined4 local_9a4;
  undefined8 *local_9a0;
  int local_8fc;
  long local_8f0;
  int local_8e4;
  int local_8e0;
  int local_8dc;
  int local_8d8;
  int local_8d4;
  int local_8d0;
  int local_8cc;
  int local_8c8;
  int local_8c4;
  int local_8c0;
  int local_8bc;
  int local_8b8;
  int local_8b4;
  int local_8b0;
  int local_8ac;
  int local_8a8;
  int local_8a4;
  int local_8a0;
  int local_89c;
  int local_898;
  int local_894;
  int local_890;
  int local_88c;
  int local_888;
  int local_884;
  int local_880;
  int local_87c;
  int local_878;
  int local_874;
  int local_870;
  uint local_86c;
  uint local_868;
  int local_864;
  undefined8 *local_860;
  uint local_858;
  int local_854;
  uint *local_850;
  int local_844;
  uint *local_840;
  int local_834;
  uint *local_830;
  int local_824;
  uint *local_820;
  int local_818;
  int local_814;
  int local_810;
  int local_80c;
  int *local_808;
  int local_800;
  uint local_7fc;
  uint local_7f8;
  int local_7f4;
  undefined8 *local_7f0;
  uint local_7e8;
  int local_7e4;
  uint *local_7e0;
  int local_7d4;
  uint *local_7d0;
  int local_7c4;
  uint *local_7c0;
  int local_7b4;
  uint *local_7b0;
  int local_7a8;
  int local_7a4;
  int local_7a0;
  int local_79c;
  int *local_798;
  int local_790;
  uint local_78c;
  uint local_788;
  int local_784;
  undefined8 *local_780;
  uint local_778;
  int local_774;
  uint *local_770;
  int local_764;
  uint *local_760;
  int local_754;
  uint *local_750;
  int local_744;
  uint *local_740;
  int local_738;
  int local_734;
  int local_730;
  int local_72c;
  int *local_728;
  int local_720;
  uint local_71c;
  uint local_718;
  int local_714;
  undefined1 *local_710;
  uint local_708;
  int local_704;
  uint *local_700;
  int local_6f4;
  uint *local_6f0;
  int local_6e4;
  uint *local_6e0;
  int local_6d4;
  uint *local_6d0;
  int local_6c8;
  int local_6c4;
  int local_6c0;
  int local_6bc;
  int *local_6b8;
  int local_6b0;
  uint local_6ac;
  uint local_6a8;
  int local_6a4;
  undefined1 *local_6a0;
  uint local_698;
  int local_694;
  uint *local_690;
  int local_684;
  uint *local_680;
  int local_674;
  uint *local_670;
  int local_664;
  uint *local_660;
  int local_658;
  int local_654;
  int local_650;
  int local_64c;
  int *local_648;
  int local_634;
  uint local_5a8;
  int local_5a4;
  uint *local_5a0;
  int local_594;
  uint *local_590;
  int local_584;
  uint local_580;
  int local_57c;
  uint *local_578;
  int local_56c;
  uint *local_568;
  int local_55c;
  uint local_558;
  int local_554;
  uint *local_550;
  int local_544;
  uint *local_540;
  int local_534;
  uint local_530;
  int local_52c;
  uint *local_528;
  int local_51c;
  uint *local_518;
  int local_50c;
  uint local_508;
  int local_504;
  uint *local_500;
  int local_4f4;
  uint *local_4f0;
  int local_4e8;
  int local_4e4;
  uint *local_4e0;
  int local_4d8;
  int local_4d4;
  uint *local_4d0;
  int local_4c8;
  int local_4c4;
  uint *local_4c0;
  int local_4b8;
  int local_4b4;
  uint *local_4b0;
  int local_4a8;
  int local_4a4;
  uint *local_4a0;
  int local_498;
  int local_3a8;
  int local_3a4;
  int local_3a0;
  int local_39c;
  long *local_398;
  int local_390;
  int local_38c;
  int local_388;
  int local_384;
  long *local_380;
  int local_378;
  int local_374;
  int local_370;
  int local_36c;
  long *local_368;
  int local_360;
  int local_35c;
  int local_358;
  int local_354;
  long *local_350;
  int local_348;
  int local_344;
  int local_340;
  int local_33c;
  long *local_338;
  int local_330;
  int local_32c;
  int local_328;
  int local_324;
  long *local_320;
  Dim3 local_318;
  Dim3 local_308;
  Dim3 local_2f8;
  Dim3 local_2e8;
  int local_2dc;
  Box *local_2d8;
  double *local_2d0;
  Dim3 local_2c8;
  Box *local_2b8;
  int local_2b0;
  int iStack_2ac;
  int local_2a8;
  undefined4 local_2a4;
  Box *local_2a0;
  undefined4 local_294;
  Box *local_290;
  undefined4 local_284;
  Box *local_280;
  Dim3 local_278;
  Box *local_268;
  int local_260;
  int iStack_25c;
  int local_258;
  undefined4 local_254;
  IntVect *local_250;
  undefined4 local_244;
  IntVect *local_240;
  undefined4 local_234;
  IntVect *local_230;
  Dim3 local_228;
  Dim3 local_214;
  Dim3 local_208;
  Dim3 local_1f8;
  int local_1ec;
  Box *local_1e8;
  double *local_1e0;
  Dim3 local_1d8;
  Box *local_1c8;
  int local_1c0;
  int iStack_1bc;
  int local_1b8;
  undefined4 local_1b4;
  Box *local_1b0;
  undefined4 local_1a4;
  Box *local_1a0;
  undefined4 local_194;
  Box *local_190;
  Dim3 local_188;
  Box *local_178;
  int local_170;
  int iStack_16c;
  int local_168;
  undefined4 local_164;
  IntVect *local_160;
  undefined4 local_154;
  IntVect *local_150;
  undefined4 local_144;
  IntVect *local_140;
  Dim3 local_138;
  Dim3 local_124;
  Dim3 local_118;
  Dim3 local_108;
  int local_fc;
  Box *local_f8;
  int *local_f0;
  Dim3 local_e8;
  Box *local_d8;
  int local_d0;
  int iStack_cc;
  int local_c8;
  undefined4 local_c4;
  Box *local_c0;
  undefined4 local_b4;
  Box *local_b0;
  undefined4 local_a4;
  Box *local_a0;
  Dim3 local_98;
  Box *local_88;
  int local_80;
  int iStack_7c;
  int local_78;
  undefined4 local_74;
  IntVect *local_70;
  undefined4 local_64;
  IntVect *local_60;
  undefined4 local_54;
  IntVect *local_50;
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  Array4 *local_38;
  int local_30;
  int local_2c;
  int local_28;
  int local_24;
  Array4 *local_20;
  int local_18;
  int local_14;
  int local_10;
  int local_c;
  Array4 *local_8;
  
  local_1320 = in_R9D;
  local_131c = in_R8D;
  local_130c = in_EDX;
  std::array<amrex::IndexType,_3UL>::array
            ((array<amrex::IndexType,_3UL> *)
             CONCAT44(in_stack_ffffffffffffe604,in_stack_ffffffffffffe600));
  for (local_1330 = 0; local_1330 < 3; local_1330 = local_1330 + 1) {
    local_1240 = std::array<amrex::IndexType,_3UL>::operator[]
                           ((array<amrex::IndexType,_3UL> *)
                            CONCAT44(in_stack_ffffffffffffe5f4,in_stack_ffffffffffffe5f0),
                            in_stack_ffffffffffffe5e8);
    local_1244 = local_1330;
    local_874 = local_1330;
    local_1240->itype = 1 << ((byte)local_1330 & 0x1f) | local_1240->itype;
  }
  GpuArray<amrex::Array4<const_double>,_3U>::GpuArray
            ((GpuArray<amrex::Array4<const_double>,_3U> *)
             CONCAT44(in_stack_ffffffffffffe604,in_stack_ffffffffffffe600));
  GpuArray<amrex::Array4<double>,_3U>::GpuArray
            ((GpuArray<amrex::Array4<double>,_3U> *)
             CONCAT44(in_stack_ffffffffffffe604,in_stack_ffffffffffffe600));
  GpuArray<amrex::Array4<const_int>,_3U>::GpuArray
            ((GpuArray<amrex::Array4<const_int>,_3U> *)
             CONCAT44(in_stack_ffffffffffffe604,in_stack_ffffffffffffe600));
  for (local_1574 = 0; local_1574 < 3; local_1574 = local_1574 + 1) {
    ppFVar13 = std::array<amrex::FArrayBox_*,_3UL>::operator[]
                         ((array<amrex::FArrayBox_*,_3UL> *)
                          CONCAT44(in_stack_ffffffffffffe5f4,in_stack_ffffffffffffe5f0),
                          in_stack_ffffffffffffe5e8);
    local_1250 = *ppFVar13;
    local_1254 = local_130c;
    local_2d0 = (local_1250->super_BaseFab<double>).dptr;
    local_2d8 = &(local_1250->super_BaseFab<double>).domain;
    local_2dc = (local_1250->super_BaseFab<double>).nvar;
    local_284 = 0;
    local_2b0 = (local_2d8->smallend).vect[0];
    local_294 = 1;
    iStack_2ac = (local_1250->super_BaseFab<double>).domain.smallend.vect[1];
    local_2f8.x = (local_2d8->smallend).vect[0];
    local_2f8.y = (local_2d8->smallend).vect[1];
    local_2a4 = 2;
    local_2f8.z = (local_1250->super_BaseFab<double>).domain.smallend.vect[2];
    local_230 = &(local_1250->super_BaseFab<double>).domain.bigend;
    local_234 = 0;
    local_260 = local_230->vect[0] + 1;
    local_240 = &(local_1250->super_BaseFab<double>).domain.bigend;
    local_244 = 1;
    iStack_25c = (local_1250->super_BaseFab<double>).domain.bigend.vect[1] + 1;
    local_250 = &(local_1250->super_BaseFab<double>).domain.bigend;
    local_254 = 2;
    local_318.z = (local_1250->super_BaseFab<double>).domain.bigend.vect[2] + 1;
    local_318.y = iStack_25c;
    local_318.x = local_260;
    local_308._0_8_ = local_318._0_8_;
    local_308.z = local_318.z;
    local_2e8._0_8_ = local_2f8._0_8_;
    local_2e8.z = local_2f8.z;
    local_2c8._0_8_ = local_2f8._0_8_;
    local_2c8.z = local_2f8.z;
    local_2b8 = local_2d8;
    local_2a8 = local_2f8.z;
    local_2a0 = local_2d8;
    local_290 = local_2d8;
    local_280 = local_2d8;
    local_278._0_8_ = local_318._0_8_;
    local_278.z = local_318.z;
    local_268 = local_2d8;
    local_258 = local_318.z;
    Array4<const_double>::Array4(&local_1298,local_2d0,&local_2e8,&local_308,local_2dc);
    Array4<const_double>::Array4<const_double,_0>(&local_15b8,&local_1298,local_1254);
    local_1204 = local_1574;
    lVar20 = (long)local_1574;
    *(ulong *)(auStack_13c8 + lVar20 * 0x40 + 4) = CONCAT44(local_15b8.end.y,local_15b8.end.x);
    *(undefined8 *)((long)local_13b0 + (lVar20 * 8 + 1) * 8 + -0x14) = local_15b8._52_8_;
    aLStack_13e8[lVar20 * 8 + 3] = local_15b8.begin._0_8_;
    *(ulong *)(auStack_13c8 + lVar20 * 0x40) = CONCAT44(local_15b8.end.x,local_15b8.begin.z);
    aLStack_13e8[lVar20 * 8 + 1] = local_15b8.kstride;
    aLStack_13e8[lVar20 * 8 + 2] = local_15b8.nstride;
    (&local_13f0)[lVar20 * 8] = (long)local_15b8.p;
    aLStack_13e8[lVar20 * 8] = local_15b8.jstride;
    local_1200 = &local_13f0;
    ppFVar13 = std::array<amrex::FArrayBox_*,_3UL>::operator[]
                         ((array<amrex::FArrayBox_*,_3UL> *)
                          CONCAT44(in_stack_ffffffffffffe5f4,in_stack_ffffffffffffe5f0),
                          in_stack_ffffffffffffe5e8);
    local_12a0 = *ppFVar13;
    local_12a4 = local_131c;
    local_1e0 = (local_12a0->super_BaseFab<double>).dptr;
    local_1e8 = &(local_12a0->super_BaseFab<double>).domain;
    local_1ec = (local_12a0->super_BaseFab<double>).nvar;
    local_194 = 0;
    local_1c0 = (local_1e8->smallend).vect[0];
    local_1a4 = 1;
    iStack_1bc = (local_12a0->super_BaseFab<double>).domain.smallend.vect[1];
    local_208.x = (local_1e8->smallend).vect[0];
    local_208.y = (local_1e8->smallend).vect[1];
    local_1b4 = 2;
    local_208.z = (local_12a0->super_BaseFab<double>).domain.smallend.vect[2];
    local_140 = &(local_12a0->super_BaseFab<double>).domain.bigend;
    local_144 = 0;
    local_170 = local_140->vect[0] + 1;
    local_150 = &(local_12a0->super_BaseFab<double>).domain.bigend;
    local_154 = 1;
    iStack_16c = (local_12a0->super_BaseFab<double>).domain.bigend.vect[1] + 1;
    local_160 = &(local_12a0->super_BaseFab<double>).domain.bigend;
    local_164 = 2;
    local_228.z = (local_12a0->super_BaseFab<double>).domain.bigend.vect[2] + 1;
    local_228.y = iStack_16c;
    local_228.x = local_170;
    local_214._0_8_ = local_228._0_8_;
    local_214.z = local_228.z;
    local_1f8._0_8_ = local_208._0_8_;
    local_1f8.z = local_208.z;
    local_1d8._0_8_ = local_208._0_8_;
    local_1d8.z = local_208.z;
    local_1c8 = local_1e8;
    local_1b8 = local_208.z;
    local_1b0 = local_1e8;
    local_1a0 = local_1e8;
    local_190 = local_1e8;
    local_188._0_8_ = local_228._0_8_;
    local_188.z = local_228.z;
    local_178 = local_1e8;
    local_168 = local_228.z;
    Array4<double>::Array4(&local_12e8,local_1e0,&local_1f8,&local_214,local_1ec);
    Array4<double>::Array4<double,_0>(&local_15f8,&local_12e8,local_12a4);
    local_1190 = local_14b0;
    local_1194 = local_1574;
    memcpy(local_1190 + (long)local_1574 * 8,&local_15f8,0x3c);
    ppIVar14 = std::array<amrex::IArrayBox_*,_3UL>::operator[]
                         ((array<amrex::IArrayBox_*,_3UL> *)
                          CONCAT44(in_stack_ffffffffffffe5f4,in_stack_ffffffffffffe5f0),
                          in_stack_ffffffffffffe5e8);
    if (*ppIVar14 != (value_type)0x0) {
      ppIVar14 = std::array<amrex::IArrayBox_*,_3UL>::operator[]
                           ((array<amrex::IArrayBox_*,_3UL> *)
                            CONCAT44(in_stack_ffffffffffffe5f4,in_stack_ffffffffffffe5f0),
                            in_stack_ffffffffffffe5e8);
      local_1140 = *ppIVar14;
      local_1144 = 0;
      local_f0 = (local_1140->super_BaseFab<int>).dptr;
      local_f8 = &(local_1140->super_BaseFab<int>).domain;
      local_fc = (local_1140->super_BaseFab<int>).nvar;
      local_a4 = 0;
      local_d0 = (local_f8->smallend).vect[0];
      local_b4 = 1;
      iStack_cc = (local_1140->super_BaseFab<int>).domain.smallend.vect[1];
      local_118.x = (local_f8->smallend).vect[0];
      local_118.y = (local_f8->smallend).vect[1];
      local_c4 = 2;
      local_118.z = (local_1140->super_BaseFab<int>).domain.smallend.vect[2];
      local_50 = &(local_1140->super_BaseFab<int>).domain.bigend;
      local_54 = 0;
      local_80 = local_50->vect[0] + 1;
      local_60 = &(local_1140->super_BaseFab<int>).domain.bigend;
      local_64 = 1;
      iStack_7c = (local_1140->super_BaseFab<int>).domain.bigend.vect[1] + 1;
      local_70 = &(local_1140->super_BaseFab<int>).domain.bigend;
      local_74 = 2;
      local_138.z = (local_1140->super_BaseFab<int>).domain.bigend.vect[2] + 1;
      local_138.y = iStack_7c;
      local_138.x = local_80;
      local_124._0_8_ = local_138._0_8_;
      local_124.z = local_138.z;
      local_108._0_8_ = local_118._0_8_;
      local_108.z = local_118.z;
      local_e8._0_8_ = local_118._0_8_;
      local_e8.z = local_118.z;
      local_d8 = local_f8;
      local_c8 = local_118.z;
      local_c0 = local_f8;
      local_b0 = local_f8;
      local_a0 = local_f8;
      local_98._0_8_ = local_138._0_8_;
      local_98.z = local_138.z;
      local_88 = local_f8;
      local_78 = local_138.z;
      Array4<const_int>::Array4(&local_1188,local_f0,&local_108,&local_124,local_fc);
      Array4<const_int>::Array4<const_int,_0>(&local_1638,&local_1188,local_1144);
      local_1100 = local_1570;
      local_1104 = local_1574;
      memcpy(local_1100 + (long)local_1574 * 0x40,&local_1638,0x3c);
    }
  }
  local_12f0 = &stack0x00000048;
  local_1078 = std::array<amrex::IndexType,_3UL>::operator[]
                         ((array<amrex::IndexType,_3UL> *)
                          CONCAT44(in_stack_ffffffffffffe5f4,in_stack_ffffffffffffe5f0),
                          in_stack_ffffffffffffe5e8);
  local_1654 = *in_stack_00000008;
  iVar17 = *(int *)(in_stack_00000008 + 1);
  iStack_1648 = (int)((ulong)iVar17 >> 0x20);
  uVar2 = in_stack_00000008[2];
  local_1644._4_4_ = (int)((ulong)uVar2 >> 0x20);
  local_163c = *(uint *)(in_stack_00000008 + 3);
  local_107c = local_1078->itype;
  local_860 = &local_1654;
  for (local_864 = 0; local_864 < 3; local_864 = local_864 + 1) {
    local_840 = &local_858;
    local_844 = local_864;
    local_834 = local_864;
    local_814 = local_864;
    bVar16 = (byte)local_864;
    local_868 = (uint)((local_107c & 1 << (bVar16 & 0x1f)) != 0);
    local_850 = &local_163c;
    local_854 = local_864;
    local_824 = local_864;
    local_818 = local_864;
    local_86c = (uint)((local_163c & 1 << (bVar16 & 0x1f)) != 0);
    local_870 = local_868 - local_86c;
    local_808 = &iStack_1648;
    local_80c = local_864;
    local_808[local_864] = local_870 + local_808[local_864];
    local_500 = &local_163c;
    local_504 = local_864;
    if (local_868 == 0) {
      local_4e4 = local_864;
      local_4d8 = local_864;
      local_163c = (1 << (bVar16 & 0x1f) ^ 0xffffffffU) & local_163c;
      local_4e0 = local_500;
    }
    else {
      local_4f4 = local_864;
      local_4e8 = local_864;
      local_163c = 1 << (bVar16 & 0x1f) | local_163c;
      local_4f0 = local_500;
    }
    local_830 = local_840;
    local_820 = local_850;
    local_810 = local_870;
    local_508 = local_868;
  }
  iVar19 = iStack_1648;
  _local_164c = iVar17;
  iVar17 = local_1644._4_4_;
  local_1644 = uVar2;
  local_858 = local_107c;
  _iVar23 = _local_164c;
  iStack_1648 = iVar19;
  uVar2 = local_1644;
  local_1644._4_4_ = iVar17;
  local_1090 = std::array<amrex::IndexType,_3UL>::operator[]
                         ((array<amrex::IndexType,_3UL> *)
                          CONCAT44(in_stack_ffffffffffffe5f4,in_stack_ffffffffffffe5f0),
                          in_stack_ffffffffffffe5e8);
  uVar5 = local_1644;
  iVar19 = _local_164c;
  local_1670 = *in_stack_00000008;
  iVar17 = *(int *)(in_stack_00000008 + 1);
  iStack_1664 = (int)((ulong)iVar17 >> 0x20);
  uVar2 = in_stack_00000008[2];
  local_1660._4_4_ = (int)((ulong)uVar2 >> 0x20);
  local_1658 = *(uint *)(in_stack_00000008 + 3);
  local_1094 = local_1090->itype;
  local_7f0 = &local_1670;
  for (local_7f4 = 0; local_7f4 < 3; local_7f4 = local_7f4 + 1) {
    local_7d0 = &local_7e8;
    local_7d4 = local_7f4;
    local_7c4 = local_7f4;
    local_7a4 = local_7f4;
    bVar16 = (byte)local_7f4;
    local_7f8 = (uint)((local_1094 & 1 << (bVar16 & 0x1f)) != 0);
    local_7e0 = &local_1658;
    local_7e4 = local_7f4;
    local_7b4 = local_7f4;
    local_7a8 = local_7f4;
    local_7fc = (uint)((local_1658 & 1 << (bVar16 & 0x1f)) != 0);
    local_800 = local_7f8 - local_7fc;
    local_798 = &iStack_1664;
    local_79c = local_7f4;
    local_798[local_7f4] = local_800 + local_798[local_7f4];
    local_528 = &local_1658;
    local_52c = local_7f4;
    if (local_7f8 == 0) {
      local_4d4 = local_7f4;
      local_4c8 = local_7f4;
      local_1658 = (1 << (bVar16 & 0x1f) ^ 0xffffffffU) & local_1658;
      local_4d0 = local_528;
    }
    else {
      local_51c = local_7f4;
      local_50c = local_7f4;
      local_1658 = 1 << (bVar16 & 0x1f) | local_1658;
      local_518 = local_528;
    }
    local_7c0 = local_7d0;
    local_7b0 = local_7e0;
    local_7a0 = local_800;
    local_530 = local_7f8;
  }
  iVar23 = iStack_1664;
  _local_1668 = iVar17;
  iVar17 = local_1660._4_4_;
  local_1660 = uVar2;
  iVar9 = iStack_1648;
  _local_164c = iVar19;
  iVar19 = local_1644._4_4_;
  local_1644 = uVar5;
  local_7e8 = local_1094;
  iVar8 = _local_1668;
  iStack_1664 = iVar23;
  uVar2 = local_1660;
  local_1660._4_4_ = iVar17;
  iVar17 = _local_164c;
  iStack_1648 = iVar9;
  uVar5 = local_1644;
  local_1644._4_4_ = iVar19;
  local_10a8 = std::array<amrex::IndexType,_3UL>::operator[]
                         ((array<amrex::IndexType,_3UL> *)
                          CONCAT44(in_stack_ffffffffffffe5f4,in_stack_ffffffffffffe5f0),
                          in_stack_ffffffffffffe5e8);
  uVar7 = local_1644;
  _iVar23 = _local_164c;
  uVar5 = local_1660;
  iVar19 = _local_1668;
  local_168c = *in_stack_00000008;
  iVar17 = *(int *)(in_stack_00000008 + 1);
  iStack_1680 = (int)((ulong)iVar17 >> 0x20);
  uVar2 = in_stack_00000008[2];
  local_167c._4_4_ = (int)((ulong)uVar2 >> 0x20);
  local_1674 = *(uint *)(in_stack_00000008 + 3);
  local_10ac = local_10a8->itype;
  local_780 = &local_168c;
  for (local_784 = 0; local_784 < 3; local_784 = local_784 + 1) {
    local_760 = &local_778;
    local_764 = local_784;
    local_754 = local_784;
    local_734 = local_784;
    bVar16 = (byte)local_784;
    local_788 = (uint)((local_10ac & 1 << (bVar16 & 0x1f)) != 0);
    local_770 = &local_1674;
    local_774 = local_784;
    local_744 = local_784;
    local_738 = local_784;
    local_78c = (uint)((local_1674 & 1 << (bVar16 & 0x1f)) != 0);
    local_790 = local_788 - local_78c;
    local_728 = &iStack_1680;
    local_72c = local_784;
    local_728[local_784] = local_790 + local_728[local_784];
    local_550 = &local_1674;
    local_554 = local_784;
    if (local_788 == 0) {
      local_4c4 = local_784;
      local_4b8 = local_784;
      local_1674 = (1 << (bVar16 & 0x1f) ^ 0xffffffffU) & local_1674;
      local_4c0 = local_550;
    }
    else {
      local_544 = local_784;
      local_534 = local_784;
      local_1674 = 1 << (bVar16 & 0x1f) | local_1674;
      local_540 = local_550;
    }
    local_750 = local_760;
    local_740 = local_770;
    local_730 = local_790;
    local_558 = local_788;
  }
  local_f90 = &local_1654;
  local_a04 = 0;
  local_f84 = (int)local_1654;
  local_a14 = 1;
  iStack_f80 = local_1654._4_4_;
  local_a24 = 2;
  local_16cc = _iVar23;
  local_b20 = &iStack_1648;
  local_b24 = 0;
  local_e98 = iStack_1648;
  local_b30 = &iStack_1648;
  local_b34 = 1;
  uStack_e94._0_4_ = uVar7;
  local_16c8 = CONCAT84(uVar7,iStack_1648);
  local_b40 = &iStack_1648;
  local_b44 = 2;
  local_16c0 = local_1644._4_4_;
  local_16b4 = local_16c8;
  local_16ac = local_16c0;
  local_16a0 = local_16cc;
  local_1690 = local_16cc;
  local_f98 = local_16cc;
  local_f7c = local_16cc;
  local_eb0 = local_16c8;
  local_ea8 = local_16c0;
  local_ea0 = local_f90;
  uStack_e94._4_4_ = local_16c0;
  local_a20 = local_f90;
  local_a10 = local_f90;
  local_a00 = local_f90;
  local_778 = local_10ac;
  local_1698 = local_f84;
  iStack_1694 = iStack_f80;
  local_16a8 = local_f84;
  iStack_16a4 = iStack_f80;
  local_fa0 = local_f84;
  iStack_f9c = iStack_f80;
  do {
    local_1644 = uVar7;
    _local_164c = _iVar23;
    local_1660 = uVar5;
    _local_1668 = iVar19;
    local_167c = uVar2;
    _local_1684 = iVar17;
    iVar9 = local_1644._4_4_;
    iVar23 = iStack_1648;
    local_1710 = local_1660._4_4_;
    local_ebc = iStack_1664;
    iVar19 = local_167c._4_4_;
    iVar17 = iStack_1680;
    if (local_16ac < local_16cc) {
      local_fb8 = &local_1670;
      local_9d4 = 0;
      local_fac = (int)local_1670;
      local_9e4 = 1;
      iStack_fa8 = local_1670._4_4_;
      local_9f4 = 2;
      local_171c = _local_1668;
      local_af0 = &iStack_1664;
      local_af4 = 0;
      local_b00 = &iStack_1664;
      local_b04 = 1;
      uStack_eb8._0_4_ = local_1660;
      local_1718 = CONCAT84(local_1660,local_ebc);
      local_b10 = &iStack_1664;
      local_b14 = 2;
      local_1704 = local_1718;
      local_16fc = local_1710;
      local_16f0 = local_171c;
      local_16e0 = local_171c;
      local_fc0 = local_171c;
      local_fa4 = local_171c;
      local_ed8 = local_1718;
      local_ed0 = local_1710;
      local_ec8 = local_fb8;
      uStack_eb8._4_4_ = local_1710;
      local_9f0 = local_fb8;
      local_9e0 = local_fb8;
      local_9d0 = local_fb8;
      local_16e8 = local_fac;
      iStack_16e4 = iStack_fa8;
      local_16f8 = local_fac;
      iStack_16f4 = iStack_fa8;
      local_fc8 = local_fac;
      iStack_fc4 = iStack_fa8;
      iVar8 = local_ebc;
      iVar10 = local_1710;
      do {
        local_1644._4_4_ = iVar9;
        iStack_1648 = iVar23;
        local_1660._4_4_ = iVar10;
        iStack_1664 = iVar8;
        local_167c._4_4_ = iVar19;
        iStack_1680 = iVar17;
        iVar9 = local_1644._4_4_;
        iVar23 = iStack_1648;
        iVar19 = local_1660._4_4_;
        iVar17 = iStack_1664;
        local_1760 = local_167c._4_4_;
        local_ee4 = iStack_1680;
        if (local_16fc < local_171c) {
          local_fe0 = &local_168c;
          local_9a4 = 0;
          local_fd4 = (int)local_168c;
          local_9b4 = 1;
          iStack_fd0 = local_168c._4_4_;
          local_9c4 = 2;
          local_176c = _local_1684;
          local_ac0 = &iStack_1680;
          local_ac4 = 0;
          local_ad0 = &iStack_1680;
          local_ad4 = 1;
          uStack_ee0._0_4_ = local_167c;
          local_1768 = CONCAT84(local_167c,local_ee4);
          local_ae0 = &iStack_1680;
          local_ae4 = 2;
          local_1754 = local_1768;
          local_174c = local_1760;
          local_1740 = local_176c;
          local_1730 = local_176c;
          local_fe8 = local_176c;
          local_fcc = local_176c;
          local_f00 = local_1768;
          local_ef8 = local_1760;
          local_ef0 = local_fe0;
          uStack_ee0._4_4_ = local_1760;
          local_9c0 = local_fe0;
          local_9b0 = local_fe0;
          local_9a0 = local_fe0;
          local_1738 = local_fd4;
          iStack_1734 = iStack_fd0;
          local_1748 = local_fd4;
          iStack_1744 = iStack_fd0;
          local_ff0 = local_fd4;
          iStack_fec = iStack_fd0;
          iVar8 = local_ee4;
          iVar10 = local_1760;
          do {
            local_1644._4_4_ = iVar9;
            iStack_1648 = iVar23;
            local_1660._4_4_ = iVar19;
            iStack_1664 = iVar17;
            local_167c._4_4_ = iVar10;
            iStack_1680 = iVar8;
            iVar10 = local_1644._4_4_;
            iVar8 = iStack_1648;
            iVar9 = local_1660._4_4_;
            iVar23 = iStack_1664;
            iVar19 = local_167c._4_4_;
            iVar17 = iStack_1680;
            if (local_174c < local_176c) {
              local_12f8 = &stack0x00000048;
              iVar18 = _local_1684;
              iStack_1680 = iVar17;
              uVar2 = local_167c;
              local_167c._4_4_ = iVar19;
              iVar17 = _local_1668;
              iStack_1664 = iVar23;
              uVar5 = local_1660;
              local_1660._4_4_ = iVar9;
              iVar19 = _local_164c;
              iStack_1648 = iVar8;
              uVar7 = local_1644;
              local_1644._4_4_ = iVar10;
              local_10c0 = std::array<amrex::IndexType,_3UL>::operator[]
                                     ((array<amrex::IndexType,_3UL> *)
                                      CONCAT44(in_stack_ffffffffffffe5f4,in_stack_ffffffffffffe5f0),
                                      in_stack_ffffffffffffe5e8);
              uVar7 = local_1644;
              iVar9 = _local_164c;
              uVar5 = local_1660;
              _iVar23 = _local_1668;
              uVar2 = local_167c;
              iVar19 = _local_1684;
              local_1794 = (undefined1  [8])*in_stack_00000008;
              iVar17 = *(int *)(in_stack_00000008 + 1);
              iStack_1788 = (int)((ulong)iVar17 >> 0x20);
              lVar20 = in_stack_00000008[2];
              local_1784._4_4_ = (int)((ulong)lVar20 >> 0x20);
              local_177c = *(uint *)(in_stack_00000008 + 3);
              local_10c4 = local_10c0->itype;
              local_710 = local_1794;
              for (local_714 = 0; local_714 < 3; local_714 = local_714 + 1) {
                local_6f0 = &local_708;
                local_6f4 = local_714;
                local_6e4 = local_714;
                local_6c4 = local_714;
                bVar16 = (byte)local_714;
                local_718 = (uint)((local_10c4 & 1 << (bVar16 & 0x1f)) != 0);
                local_700 = &local_177c;
                local_704 = local_714;
                local_6d4 = local_714;
                local_6c8 = local_714;
                local_71c = (uint)((local_177c & 1 << (bVar16 & 0x1f)) != 0);
                local_720 = local_718 - local_71c;
                local_6b8 = &iStack_1788;
                local_6bc = local_714;
                local_6b8[local_714] = local_720 + local_6b8[local_714];
                local_578 = &local_177c;
                local_57c = local_714;
                if (local_718 == 0) {
                  local_4b4 = local_714;
                  local_4a8 = local_714;
                  local_177c = (1 << (bVar16 & 0x1f) ^ 0xffffffffU) & local_177c;
                  local_4b0 = local_578;
                }
                else {
                  local_56c = local_714;
                  local_55c = local_714;
                  local_177c = 1 << (bVar16 & 0x1f) | local_177c;
                  local_568 = local_578;
                }
                local_6e0 = local_6f0;
                local_6d0 = local_700;
                local_6c0 = local_720;
                local_580 = local_718;
              }
              iVar8 = iStack_1788;
              _local_178c = iVar17;
              iVar17 = local_1784._4_4_;
              local_1784 = lVar20;
              iVar10 = iStack_1680;
              _local_1684 = iVar19;
              iVar19 = local_167c._4_4_;
              local_167c = uVar2;
              iVar18 = iStack_1664;
              _local_1668 = _iVar23;
              iVar23 = local_1660._4_4_;
              local_1660 = uVar5;
              iVar21 = iStack_1648;
              _local_164c = iVar9;
              iVar9 = local_1644._4_4_;
              local_1644 = uVar7;
              local_708 = local_10c4;
              _iVar22 = _local_178c;
              iStack_1788 = iVar8;
              lVar20 = local_1784;
              local_1784._4_4_ = iVar17;
              iVar17 = _local_1684;
              iStack_1680 = iVar10;
              uVar2 = local_167c;
              local_167c._4_4_ = iVar19;
              iVar19 = _local_1668;
              iStack_1664 = iVar18;
              uVar5 = local_1660;
              local_1660._4_4_ = iVar23;
              _iVar23 = _local_164c;
              iStack_1648 = iVar21;
              uVar7 = local_1644;
              local_1644._4_4_ = iVar9;
              local_10d8 = std::array<amrex::IndexType,_3UL>::operator[]
                                     ((array<amrex::IndexType,_3UL> *)
                                      CONCAT44(in_stack_ffffffffffffe5f4,in_stack_ffffffffffffe5f0),
                                      in_stack_ffffffffffffe5e8);
              uVar7 = local_1644;
              iVar8 = _local_164c;
              uVar5 = local_1660;
              iVar9 = _local_1668;
              uVar2 = local_167c;
              _iVar23 = _local_1684;
              lVar4 = local_1784;
              iVar19 = _local_178c;
              local_17b0 = (undefined1  [8])*in_stack_00000008;
              iVar17 = *(int *)(in_stack_00000008 + 1);
              iStack_17a4 = (int)((ulong)iVar17 >> 0x20);
              lVar20 = in_stack_00000008[2];
              local_17a0._4_4_ = (int)((ulong)lVar20 >> 0x20);
              local_1798 = *(uint *)(in_stack_00000008 + 3);
              local_10dc = local_10d8->itype;
              local_6a0 = local_17b0;
              for (local_6a4 = 0; local_6a4 < 3; local_6a4 = local_6a4 + 1) {
                local_680 = &local_698;
                local_684 = local_6a4;
                local_674 = local_6a4;
                local_654 = local_6a4;
                bVar16 = (byte)local_6a4;
                local_6a8 = (uint)((local_10dc & 1 << (bVar16 & 0x1f)) != 0);
                local_690 = &local_1798;
                local_694 = local_6a4;
                local_664 = local_6a4;
                local_658 = local_6a4;
                local_6ac = (uint)((local_1798 & 1 << (bVar16 & 0x1f)) != 0);
                local_6b0 = local_6a8 - local_6ac;
                local_648 = &iStack_17a4;
                local_64c = local_6a4;
                local_648[local_6a4] = local_6b0 + local_648[local_6a4];
                local_5a0 = &local_1798;
                local_5a4 = local_6a4;
                if (local_6a8 == 0) {
                  local_4a4 = local_6a4;
                  local_498 = local_6a4;
                  local_1798 = (1 << (bVar16 & 0x1f) ^ 0xffffffffU) & local_1798;
                  local_4a0 = local_5a0;
                }
                else {
                  local_594 = local_6a4;
                  local_584 = local_6a4;
                  local_1798 = 1 << (bVar16 & 0x1f) | local_1798;
                  local_590 = local_5a0;
                }
                local_670 = local_680;
                local_660 = local_690;
                local_650 = local_6b0;
                local_5a8 = local_6a8;
              }
              iVar10 = iStack_17a4;
              _local_17a8 = iVar17;
              iVar17 = local_17a0._4_4_;
              local_17a0 = lVar20;
              iVar18 = iStack_1788;
              _local_178c = iVar19;
              iVar19 = local_1784._4_4_;
              local_1784 = lVar4;
              iVar21 = iStack_1680;
              _local_1684 = _iVar23;
              iVar23 = local_167c._4_4_;
              local_167c = uVar2;
              iVar22 = iStack_1664;
              _local_1668 = iVar9;
              iVar9 = local_1660._4_4_;
              local_1660 = uVar5;
              iVar6 = iStack_1648;
              _local_164c = iVar8;
              iVar8 = local_1644._4_4_;
              local_1644 = uVar7;
              local_698 = local_10dc;
              _iVar24 = _local_17a8;
              iStack_17a4 = iVar10;
              lVar20 = local_17a0;
              local_17a0._4_4_ = iVar17;
              iVar17 = _local_178c;
              iStack_1788 = iVar18;
              lVar4 = local_1784;
              local_1784._4_4_ = iVar19;
              iVar19 = _local_1684;
              iStack_1680 = iVar21;
              uVar2 = local_167c;
              local_167c._4_4_ = iVar23;
              _iVar23 = _local_1668;
              iStack_1664 = iVar22;
              uVar5 = local_1660;
              local_1660._4_4_ = iVar9;
              iVar9 = _local_164c;
              iStack_1648 = iVar6;
              uVar7 = local_1644;
              local_1644._4_4_ = iVar8;
              pvVar15 = std::array<amrex::IndexType,_3UL>::operator[]
                                  ((array<amrex::IndexType,_3UL> *)
                                   CONCAT44(in_stack_ffffffffffffe5f4,in_stack_ffffffffffffe5f0),
                                   in_stack_ffffffffffffe5e8);
              lVar4 = local_1784;
              unique0x10002325 = _local_178c;
              lVar20 = local_17a0;
              unique0x1000230d = _local_17a8;
              uVar2 = *in_stack_00000008;
              local_17c4 = (int)in_stack_00000008[1];
              aiStack_17c0[0] = (int)((ulong)in_stack_00000008[1] >> 0x20);
              aiStack_17c0[1] = (int)in_stack_00000008[2];
              aiStack_17c0[2] = (int)((ulong)in_stack_00000008[2] >> 0x20);
              aiStack_17c0[3] = *(int *)(in_stack_00000008 + 3);
              uVar1 = pvVar15->itype;
              for (local_634 = 0; local_634 < 3; local_634 = local_634 + 1) {
                bVar16 = (byte)local_634;
                uVar12 = (uint)((uVar1 & 1 << (bVar16 & 0x1f)) != 0);
                aiStack_17c0[local_634] =
                     (uVar12 - ((aiStack_17c0[3] & 1 << (bVar16 & 0x1f)) != 0)) +
                     aiStack_17c0[local_634];
                if (uVar12 == 0) {
                  aiStack_17c0[3] = (1 << (bVar16 & 0x1f) ^ 0xffffffffU) & aiStack_17c0[3];
                }
                else {
                  aiStack_17c0[3] = 1 << (bVar16 & 0x1f) | aiStack_17c0[3];
                }
              }
              for (; local_1810._0_4_ = (long)local_1794._4_4_, local_1810._4_4_ <= local_1784._4_4_
                  ; local_1810._4_4_ = local_1810._4_4_ + 1) {
                for (; local_1814 = local_1794._0_4_, (int)(long)local_1810 <= lVar4;
                    local_1810._0_4_ = (long)((int)(long)local_1810 + 1)) {
                  for (; local_1814 <= iStack_1788; local_1814 = local_1814 + 1) {
                    for (local_1818 = 0; local_1818 < local_1320; local_1818 = local_1818 + 1) {
                      local_19f0 = *in_stack_00000010;
                      if (local_19f0 == 1) {
                        local_8e4 = local_1814;
                      }
                      else if (local_19f0 == 2) {
                        if (local_1814 < 0) {
                          iVar17 = local_1814 + 1;
                          if (iVar17 < 1) {
                            iVar17 = -iVar17;
                          }
                          local_19e8 = -iVar17 / 2 + -1;
                        }
                        else {
                          local_19e8 = local_1814 / 2;
                        }
                        local_8e4 = local_19e8;
                      }
                      else if (local_19f0 == 4) {
                        if (local_1814 < 0) {
                          iVar17 = local_1814 + 1;
                          if (iVar17 < 1) {
                            iVar17 = -iVar17;
                          }
                          local_19ec = -iVar17 / 4 + -1;
                        }
                        else {
                          local_19ec = local_1814 / 4;
                        }
                        local_8e4 = local_19ec;
                      }
                      else {
                        if (local_1814 < 0) {
                          iVar17 = local_1814 + 1;
                          if (iVar17 < 1) {
                            iVar17 = -iVar17;
                          }
                          local_19f0 = -iVar17 / local_19f0 + -1;
                        }
                        else {
                          local_19f0 = local_1814 / local_19f0;
                        }
                        local_8e4 = local_19f0;
                      }
                      if (local_1814 != local_8e4 * *in_stack_00000010) {
                        dVar3 = (double)(local_1814 - local_8e4 * *in_stack_00000010) *
                                (1.0 / (double)*in_stack_00000010);
                        *(double *)
                         (local_14b0[0] +
                         ((long)(local_1814 - iStack_1490) +
                          ((int)(long)local_1810 - iStack_148c) * local_14b0[1] +
                          (local_1810._4_4_ - iStack_1488) * local_14b0[2] +
                         local_1818 * local_14b0[3]) * 8) =
                             (1.0 - dVar3) *
                             *(double *)
                              (local_14b0[0] +
                              ((long)(local_8e4 * *in_stack_00000010 - iStack_1490) +
                               ((int)(long)local_1810 - iStack_148c) * local_14b0[1] +
                               (local_1810._4_4_ - iStack_1488) * local_14b0[2] +
                              local_1818 * local_14b0[3]) * 8) +
                             dVar3 * *(double *)
                                      (local_14b0[0] +
                                      ((long)((local_8e4 + 1) * *in_stack_00000010 - iStack_1490) +
                                       ((int)(long)local_1810 - iStack_148c) * local_14b0[1] +
                                       (local_1810._4_4_ - iStack_1488) * local_14b0[2] +
                                      local_1818 * local_14b0[3]) * 8);
                      }
                    }
                  }
                }
              }
              for (; local_1860._0_4_ = (long)local_17b0._4_4_, local_1860._4_4_ <= local_17a0._4_4_
                  ; local_1860._4_4_ = local_1860._4_4_ + 1) {
                for (; local_1864 = local_17b0._0_4_, (int)(long)local_1860 <= lVar20;
                    local_1860._0_4_ = (long)((int)(long)local_1860 + 1)) {
                  for (; local_1864 <= iStack_17a4; local_1864 = local_1864 + 1) {
                    for (local_1868 = 0; local_1868 < local_1320; local_1868 = local_1868 + 1) {
                      iVar17 = in_stack_00000010[1];
                      if (iVar17 == 1) {
                        local_8f0._0_4_ = (long)local_1860;
                      }
                      else if (iVar17 == 2) {
                        if ((int)(long)local_1860 < 0) {
                          iVar17 = (int)(long)local_1860 + 1;
                          if (iVar17 < 1) {
                            iVar17 = -iVar17;
                          }
                          local_19f8._0_4_ = (long)(-iVar17 / 2 + -1);
                        }
                        else {
                          local_19f8._0_4_ = (long)((int)(long)local_1860 / 2);
                        }
                        local_8f0._0_4_ = (long)local_19f8;
                      }
                      else if (iVar17 == 4) {
                        if ((int)(long)local_1860 < 0) {
                          iVar17 = (int)(long)local_1860 + 1;
                          if (iVar17 < 1) {
                            iVar17 = -iVar17;
                          }
                          local_8f0._0_4_ = (long)(-iVar17 / 4 + -1);
                        }
                        else {
                          local_8f0._0_4_ = (long)((int)(long)local_1860 / 4);
                        }
                      }
                      else if ((int)(long)local_1860 < 0) {
                        iVar19 = (int)(long)local_1860 + 1;
                        if (iVar19 < 1) {
                          iVar19 = -iVar19;
                        }
                        local_8f0._0_4_ = (long)(-iVar19 / iVar17 + -1);
                      }
                      else {
                        local_8f0._0_4_ = (long)((int)(long)local_1860 / iVar17);
                      }
                      if ((long)local_1860 != (long)((int)(long)local_8f0 * in_stack_00000010[1])) {
                        dVar3 = (double)((int)(long)local_1860 -
                                        (int)(long)local_8f0 * in_stack_00000010[1]) *
                                (1.0 / (double)in_stack_00000010[1]);
                        *(double *)
                         (local_1470 +
                         ((long)(local_1864 - local_1450) +
                          ((int)(long)local_1860 - local_144c) * local_1468 +
                          (local_1860._4_4_ - local_1448) * local_1460 + local_1868 * local_1458) *
                         8) = (1.0 - dVar3) *
                              *(double *)
                               (local_1470 +
                               ((long)(local_1864 - local_1450) +
                                ((int)(long)local_8f0 * in_stack_00000010[1] - local_144c) *
                                local_1468 + (local_1860._4_4_ - local_1448) * local_1460 +
                               local_1868 * local_1458) * 8) +
                              dVar3 * *(double *)
                                       (local_1470 +
                                       ((long)(local_1864 - local_1450) +
                                        (((int)(long)local_8f0 + 1) * in_stack_00000010[1] -
                                        local_144c) * local_1468 +
                                        (local_1860._4_4_ - local_1448) * local_1460 +
                                       local_1868 * local_1458) * 8);
                      }
                    }
                  }
                }
              }
              local_17cc = (int)uVar2;
              iStack_17c8 = (int)((ulong)uVar2 >> 0x20);
              for (local_18ac = local_17c4; local_18b0 = iStack_17c8, local_18ac <= aiStack_17c0[2];
                  local_18ac = local_18ac + 1) {
                for (; local_18b4 = local_17cc, local_18b0 <= aiStack_17c0[1];
                    local_18b0 = local_18b0 + 1) {
                  for (; local_18b4 <= aiStack_17c0[0]; local_18b4 = local_18b4 + 1) {
                    for (local_18b8 = 0; local_18b8 < local_1320; local_18b8 = local_18b8 + 1) {
                      local_8fc = in_stack_00000010[2];
                      if (local_8fc == 1) {
                        local_8fc = local_18ac;
                      }
                      else if (local_8fc == 2) {
                        if (local_18ac < 0) {
                          iVar17 = local_18ac + 1;
                          if (iVar17 < 1) {
                            iVar17 = -iVar17;
                          }
                          local_1a08 = -iVar17 / 2 + -1;
                        }
                        else {
                          local_1a08 = local_18ac / 2;
                        }
                        local_8fc = local_1a08;
                      }
                      else if (local_8fc == 4) {
                        if (local_18ac < 0) {
                          iVar17 = local_18ac + 1;
                          if (iVar17 < 1) {
                            iVar17 = -iVar17;
                          }
                          local_8fc = -iVar17 / 4 + -1;
                        }
                        else {
                          local_8fc = local_18ac / 4;
                        }
                      }
                      else if (local_18ac < 0) {
                        iVar17 = local_18ac + 1;
                        if (iVar17 < 1) {
                          iVar17 = -iVar17;
                        }
                        local_8fc = -iVar17 / local_8fc + -1;
                      }
                      else {
                        local_8fc = local_18ac / local_8fc;
                      }
                      if (local_18ac != local_8fc * in_stack_00000010[2]) {
                        dVar3 = (double)(local_18ac - local_8fc * in_stack_00000010[2]) *
                                (1.0 / (double)in_stack_00000010[2]);
                        *(double *)
                         (local_1430 +
                         ((long)(local_18b4 - local_1410) + (local_18b0 - local_140c) * local_1428 +
                          (local_18ac - local_1408) * local_1420 + local_18b8 * local_1418) * 8) =
                             (1.0 - dVar3) *
                             *(double *)
                              (local_1430 +
                              ((long)(local_18b4 - local_1410) +
                               (local_18b0 - local_140c) * local_1428 +
                               (local_8fc * in_stack_00000010[2] - local_1408) * local_1420 +
                              local_18b8 * local_1418) * 8) +
                             dVar3 * *(double *)
                                      (local_1430 +
                                      ((long)(local_18b4 - local_1410) +
                                       (local_18b0 - local_140c) * local_1428 +
                                       ((local_8fc + 1) * in_stack_00000010[2] - local_1408) *
                                       local_1420 + local_18b8 * local_1418) * 8);
                      }
                    }
                  }
                }
              }
              return;
            }
            for (local_1770 = iStack_1734; local_1644._4_4_ = iVar10, iStack_1648 = iVar8,
                local_1660._4_4_ = iVar9, iStack_1664 = iVar23, local_167c._4_4_ = iVar19,
                iStack_1680 = iVar17, iVar9 = local_1644._4_4_, iVar23 = iStack_1648,
                iVar19 = local_1660._4_4_, iVar17 = iStack_1664, iVar10 = local_167c._4_4_,
                iVar8 = iStack_1680, local_1770 <= local_1754._4_4_; local_1770 = local_1770 + 1) {
              for (local_1774 = local_1738; local_1644._4_4_ = iVar9, iStack_1648 = iVar23,
                  local_1660._4_4_ = iVar19, iStack_1664 = iVar17, local_167c._4_4_ = iVar10,
                  iStack_1680 = iVar8, iVar10 = local_1644._4_4_, iVar8 = iStack_1648,
                  iVar9 = local_1660._4_4_, iVar23 = iStack_1664, iVar19 = local_167c._4_4_,
                  iVar17 = iStack_1680, local_1774 <= (int)local_1754; local_1774 = local_1774 + 1)
              {
                for (local_1778 = 0; local_1644._4_4_ = iVar10, iStack_1648 = iVar8,
                    local_1660._4_4_ = iVar9, iStack_1664 = iVar23, local_167c._4_4_ = iVar19,
                    iStack_1680 = iVar17, iVar9 = local_1644._4_4_, iVar23 = iStack_1648,
                    iVar19 = local_1660._4_4_, iVar17 = iStack_1664, iVar10 = local_167c._4_4_,
                    iVar8 = iStack_1680, local_1778 < local_1320; local_1778 = local_1778 + 1) {
                  local_11c0 = local_14b0;
                  local_11c4 = 2;
                  local_de8 = &local_1430;
                  local_1230 = &local_13f0;
                  local_1234 = 2;
                  local_df0 = local_1370;
                  local_1130 = local_1570;
                  local_1134 = 2;
                  local_df8 = local_14f0;
                  local_dd4 = local_1774;
                  local_dd8 = local_1770;
                  local_ddc = local_176c;
                  local_de0 = local_1778;
                  local_e00 = in_stack_00000010;
                  local_bd0 = in_stack_00000010;
                  local_bd4 = 2;
                  local_8c8 = in_stack_00000010[2];
                  local_8c4 = local_176c;
                  if (local_8c8 == 1) {
                    local_8c0 = local_176c;
                  }
                  else if (local_8c8 == 2) {
                    if (local_176c < 0) {
                      iVar18 = local_176c + 1;
                      if (iVar18 < 1) {
                        iVar18 = -iVar18;
                      }
                      local_1970 = -iVar18 / 2 + -1;
                    }
                    else {
                      local_1970 = local_176c / 2;
                    }
                    local_8c0 = local_1970;
                  }
                  else if (local_8c8 == 4) {
                    if (local_176c < 0) {
                      iVar18 = local_176c + 1;
                      if (iVar18 < 1) {
                        iVar18 = -iVar18;
                      }
                      local_1974 = -iVar18 / 4 + -1;
                    }
                    else {
                      local_1974 = local_176c / 4;
                    }
                    local_8c0 = local_1974;
                  }
                  else {
                    if (local_176c < 0) {
                      iVar18 = local_176c + 1;
                      if (iVar18 < 1) {
                        iVar18 = -iVar18;
                      }
                      local_1978 = -iVar18 / local_8c8 + -1;
                    }
                    else {
                      local_1978 = local_176c / local_8c8;
                    }
                    local_8c0 = local_1978;
                  }
                  local_e04 = local_8c0;
                  local_be0 = in_stack_00000010;
                  local_be4 = 2;
                  iVar18 = _local_1684;
                  uVar2 = local_167c;
                  _iVar21 = _local_1668;
                  uVar5 = local_1660;
                  _iVar22 = _local_164c;
                  uVar7 = local_1644;
                  if (local_8c0 * in_stack_00000010[2] == local_176c) {
                    local_bf0 = in_stack_00000010;
                    local_bf4 = 0;
                    local_8d4 = *in_stack_00000010;
                    local_8d0 = local_1774;
                    if (local_8d4 == 1) {
                      local_8cc = local_1774;
                    }
                    else if (local_8d4 == 2) {
                      if (local_1774 < 0) {
                        iVar18 = local_1774 + 1;
                        if (iVar18 < 1) {
                          iVar18 = -iVar18;
                        }
                        local_1980 = -iVar18 / 2 + -1;
                      }
                      else {
                        local_1980 = local_1774 / 2;
                      }
                      local_8cc = local_1980;
                    }
                    else if (local_8d4 == 4) {
                      if (local_1774 < 0) {
                        iVar18 = local_1774 + 1;
                        if (iVar18 < 1) {
                          iVar18 = -iVar18;
                        }
                        local_1984 = -iVar18 / 4 + -1;
                      }
                      else {
                        local_1984 = local_1774 / 4;
                      }
                      local_8cc = local_1984;
                    }
                    else {
                      if (local_1774 < 0) {
                        iVar18 = local_1774 + 1;
                        if (iVar18 < 1) {
                          iVar18 = -iVar18;
                        }
                        local_1988 = -iVar18 / local_8d4 + -1;
                      }
                      else {
                        local_1988 = local_1774 / local_8d4;
                      }
                      local_8cc = local_1988;
                    }
                    local_e08 = local_8cc;
                    local_c00 = in_stack_00000010;
                    local_c04 = 1;
                    local_8e0 = in_stack_00000010[1];
                    local_8dc = local_1770;
                    if (local_8e0 == 1) {
                      local_8d8 = local_1770;
                    }
                    else if (local_8e0 == 2) {
                      if (local_1770 < 0) {
                        iVar18 = local_1770 + 1;
                        if (iVar18 < 1) {
                          iVar18 = -iVar18;
                        }
                        local_1990 = -iVar18 / 2 + -1;
                      }
                      else {
                        local_1990 = local_1770 / 2;
                      }
                      local_8d8 = local_1990;
                    }
                    else if (local_8e0 == 4) {
                      if (local_1770 < 0) {
                        iVar18 = local_1770 + 1;
                        if (iVar18 < 1) {
                          iVar18 = -iVar18;
                        }
                        local_1994 = -iVar18 / 4 + -1;
                      }
                      else {
                        local_1994 = local_1770 / 4;
                      }
                      local_8d8 = local_1994;
                    }
                    else {
                      if (local_1770 < 0) {
                        iVar18 = local_1770 + 1;
                        if (iVar18 < 1) {
                          iVar18 = -iVar18;
                        }
                        local_1998 = -iVar18 / local_8e0 + -1;
                      }
                      else {
                        local_1998 = local_1770 / local_8e0;
                      }
                      local_8d8 = local_1998;
                    }
                    local_e0c = local_8d8;
                    iVar18 = _local_1684;
                    iStack_1680 = iVar8;
                    local_167c._4_4_ = iVar10;
                    iVar8 = _local_1668;
                    iStack_1664 = iVar17;
                    local_1660._4_4_ = iVar19;
                    iVar17 = _local_164c;
                    iStack_1648 = iVar23;
                    local_1644._4_4_ = iVar9;
                    bVar11 = Array4::operator_cast_to_bool(local_df8);
                    uVar7 = local_1644;
                    _iVar22 = _local_164c;
                    uVar5 = local_1660;
                    _iVar21 = _local_1668;
                    uVar2 = local_167c;
                    iVar18 = _local_1684;
                    iVar8 = iStack_1680;
                    iVar10 = local_167c._4_4_;
                    iVar17 = iStack_1664;
                    iVar19 = local_1660._4_4_;
                    iVar23 = iStack_1648;
                    iVar9 = local_1644._4_4_;
                    if (bVar11) {
                      local_38 = local_df8;
                      local_3c = local_e08;
                      local_40 = local_e0c;
                      local_44 = local_e04;
                      local_48 = local_de0;
                      if (*(int *)(*(long *)local_df8 +
                                  ((long)(local_e08 - *(int *)(local_df8 + 0x20)) +
                                   (long)(local_e0c - *(int *)(local_df8 + 0x24)) *
                                   *(long *)(local_df8 + 8) +
                                   (long)(local_e04 - *(int *)(local_df8 + 0x28)) *
                                   *(long *)(local_df8 + 0x10) +
                                  (long)local_de0 * *(long *)(local_df8 + 0x18)) * 4) == 0)
                      goto LAB_01324b56;
                    }
                    local_350 = local_df0;
                    local_354 = local_e08;
                    local_358 = local_e0c;
                    local_35c = local_e04;
                    local_360 = local_de0;
                    local_398 = local_de8;
                    local_39c = local_dd4;
                    local_3a0 = local_dd8;
                    local_3a4 = local_ddc;
                    local_3a8 = local_de0;
                    *(undefined8 *)
                     (*local_de8 +
                     ((long)(local_dd4 - (int)local_de8[4]) +
                      (long)(local_dd8 - *(int *)((long)local_de8 + 0x24)) * local_de8[1] +
                      (long)(local_ddc - (int)local_de8[5]) * local_de8[2] +
                     (long)local_de0 * local_de8[3]) * 8) =
                         *(undefined8 *)
                          (*local_df0 +
                          ((long)(local_e08 - (int)local_df0[4]) +
                           (long)(local_e0c - *(int *)((long)local_df0 + 0x24)) * local_df0[1] +
                           (long)(local_e04 - (int)local_df0[5]) * local_df0[2] +
                          (long)local_de0 * local_df0[3]) * 8);
                  }
LAB_01324b56:
                  local_1644._4_4_ = iVar9;
                  iStack_1648 = iVar23;
                  local_1660._4_4_ = iVar19;
                  iStack_1664 = iVar17;
                  local_167c._4_4_ = iVar10;
                  iStack_1680 = iVar8;
                  local_1644 = uVar7;
                  _local_164c = _iVar22;
                  local_1660 = uVar5;
                  _local_1668 = _iVar21;
                  local_167c = uVar2;
                  _local_1684 = iVar18;
                  iVar10 = local_1644._4_4_;
                  iVar8 = iStack_1648;
                  iVar9 = local_1660._4_4_;
                  iVar23 = iStack_1664;
                  iVar19 = local_167c._4_4_;
                  iVar17 = iStack_1680;
                }
              }
            }
            local_176c = local_176c + 1;
          } while( true );
        }
        for (local_1720 = iStack_16e4; local_1644._4_4_ = iVar9, iStack_1648 = iVar23,
            local_1660._4_4_ = iVar19, iStack_1664 = iVar17, local_167c._4_4_ = local_1760,
            iStack_1680 = local_ee4, iVar9 = local_1644._4_4_, iVar23 = iStack_1648,
            iVar10 = local_1660._4_4_, iVar8 = iStack_1664, iVar19 = local_167c._4_4_,
            iVar17 = iStack_1680, local_1720 <= local_1704._4_4_; local_1720 = local_1720 + 1) {
          for (local_1724 = local_16e8; local_1644._4_4_ = iVar9, iStack_1648 = iVar23,
              local_1660._4_4_ = iVar10, iStack_1664 = iVar8, local_167c._4_4_ = iVar19,
              iStack_1680 = iVar17, iVar9 = local_1644._4_4_, iVar23 = iStack_1648,
              iVar19 = local_1660._4_4_, iVar17 = iStack_1664, local_1760 = local_167c._4_4_,
              local_ee4 = iStack_1680, local_1724 <= (int)local_1704; local_1724 = local_1724 + 1) {
            for (local_1728 = 0; local_1644._4_4_ = iVar9, iStack_1648 = iVar23,
                local_1660._4_4_ = iVar19, iStack_1664 = iVar17, local_167c._4_4_ = local_1760,
                iStack_1680 = local_ee4, iVar9 = local_1644._4_4_, iVar23 = iStack_1648,
                iVar10 = local_1660._4_4_, iVar8 = iStack_1664, iVar19 = local_167c._4_4_,
                iVar17 = iStack_1680, local_1728 < local_1320; local_1728 = local_1728 + 1) {
              local_11b0 = local_14b0;
              local_11b4 = 1;
              local_e28 = &local_1470;
              local_1220 = &local_13f0;
              local_1224 = 1;
              local_e30 = local_13b0;
              local_1120 = local_1570;
              local_1124 = 1;
              local_e38 = local_1530;
              local_e10 = local_1724;
              local_e14 = local_1720;
              local_e18 = local_171c;
              local_e1c = local_1728;
              local_e40 = in_stack_00000010;
              local_b90 = in_stack_00000010;
              local_b94 = 1;
              local_8a4 = in_stack_00000010[1];
              local_8a0 = local_1720;
              if (local_8a4 == 1) {
                local_89c = local_1720;
              }
              else if (local_8a4 == 2) {
                if (local_1720 < 0) {
                  iVar18 = local_1720 + 1;
                  if (iVar18 < 1) {
                    iVar18 = -iVar18;
                  }
                  local_1940 = -iVar18 / 2 + -1;
                }
                else {
                  local_1940 = local_1720 / 2;
                }
                local_89c = local_1940;
              }
              else if (local_8a4 == 4) {
                if (local_1720 < 0) {
                  iVar18 = local_1720 + 1;
                  if (iVar18 < 1) {
                    iVar18 = -iVar18;
                  }
                  local_1944 = -iVar18 / 4 + -1;
                }
                else {
                  local_1944 = local_1720 / 4;
                }
                local_89c = local_1944;
              }
              else {
                if (local_1720 < 0) {
                  iVar18 = local_1720 + 1;
                  if (iVar18 < 1) {
                    iVar18 = -iVar18;
                  }
                  local_1948 = -iVar18 / local_8a4 + -1;
                }
                else {
                  local_1948 = local_1720 / local_8a4;
                }
                local_89c = local_1948;
              }
              local_e44 = local_89c;
              local_ba0 = in_stack_00000010;
              local_ba4 = 1;
              iVar18 = _local_1684;
              uVar2 = local_167c;
              _iVar21 = _local_1668;
              uVar5 = local_1660;
              _iVar22 = _local_164c;
              uVar7 = local_1644;
              if (local_89c * in_stack_00000010[1] == local_1720) {
                local_bb0 = in_stack_00000010;
                local_bb4 = 0;
                local_8b0 = *in_stack_00000010;
                local_8ac = local_1724;
                if (local_8b0 == 1) {
                  local_8a8 = local_1724;
                }
                else if (local_8b0 == 2) {
                  if (local_1724 < 0) {
                    iVar18 = local_1724 + 1;
                    if (iVar18 < 1) {
                      iVar18 = -iVar18;
                    }
                    local_1950 = -iVar18 / 2 + -1;
                  }
                  else {
                    local_1950 = local_1724 / 2;
                  }
                  local_8a8 = local_1950;
                }
                else if (local_8b0 == 4) {
                  if (local_1724 < 0) {
                    iVar18 = local_1724 + 1;
                    if (iVar18 < 1) {
                      iVar18 = -iVar18;
                    }
                    local_1954 = -iVar18 / 4 + -1;
                  }
                  else {
                    local_1954 = local_1724 / 4;
                  }
                  local_8a8 = local_1954;
                }
                else {
                  if (local_1724 < 0) {
                    iVar18 = local_1724 + 1;
                    if (iVar18 < 1) {
                      iVar18 = -iVar18;
                    }
                    local_1958 = -iVar18 / local_8b0 + -1;
                  }
                  else {
                    local_1958 = local_1724 / local_8b0;
                  }
                  local_8a8 = local_1958;
                }
                local_e48 = local_8a8;
                local_bc0 = in_stack_00000010;
                local_bc4 = 2;
                local_8bc = in_stack_00000010[2];
                local_8b8 = local_171c;
                if (local_8bc == 1) {
                  local_8b4 = local_171c;
                }
                else if (local_8bc == 2) {
                  if (local_171c < 0) {
                    iVar18 = local_171c + 1;
                    if (iVar18 < 1) {
                      iVar18 = -iVar18;
                    }
                    local_1960 = -iVar18 / 2 + -1;
                  }
                  else {
                    local_1960 = local_171c / 2;
                  }
                  local_8b4 = local_1960;
                }
                else if (local_8bc == 4) {
                  if (local_171c < 0) {
                    iVar18 = local_171c + 1;
                    if (iVar18 < 1) {
                      iVar18 = -iVar18;
                    }
                    local_1964 = -iVar18 / 4 + -1;
                  }
                  else {
                    local_1964 = local_171c / 4;
                  }
                  local_8b4 = local_1964;
                }
                else {
                  if (local_171c < 0) {
                    iVar18 = local_171c + 1;
                    if (iVar18 < 1) {
                      iVar18 = -iVar18;
                    }
                    local_1968 = -iVar18 / local_8bc + -1;
                  }
                  else {
                    local_1968 = local_171c / local_8bc;
                  }
                  local_8b4 = local_1968;
                }
                local_e4c = local_8b4;
                iVar18 = _local_1684;
                iStack_1680 = iVar17;
                local_167c._4_4_ = iVar19;
                iVar17 = _local_1668;
                iStack_1664 = iVar8;
                local_1660._4_4_ = iVar10;
                iVar19 = _local_164c;
                iStack_1648 = iVar23;
                local_1644._4_4_ = iVar9;
                bVar11 = Array4::operator_cast_to_bool(local_e38);
                uVar7 = local_1644;
                _iVar22 = _local_164c;
                uVar5 = local_1660;
                _iVar21 = _local_1668;
                uVar2 = local_167c;
                iVar18 = _local_1684;
                iVar17 = iStack_1680;
                iVar19 = local_167c._4_4_;
                iVar8 = iStack_1664;
                iVar10 = local_1660._4_4_;
                iVar23 = iStack_1648;
                iVar9 = local_1644._4_4_;
                if (bVar11) {
                  local_20 = local_e38;
                  local_24 = local_e48;
                  local_28 = local_e44;
                  local_2c = local_e4c;
                  local_30 = local_e1c;
                  if (*(int *)(*(long *)local_e38 +
                              ((long)(local_e48 - *(int *)(local_e38 + 0x20)) +
                               (long)(local_e44 - *(int *)(local_e38 + 0x24)) *
                               *(long *)(local_e38 + 8) +
                               (long)(local_e4c - *(int *)(local_e38 + 0x28)) *
                               *(long *)(local_e38 + 0x10) +
                              (long)local_e1c * *(long *)(local_e38 + 0x18)) * 4) == 0)
                  goto LAB_01324036;
                }
                local_338 = local_e30;
                local_33c = local_e48;
                local_340 = local_e44;
                local_344 = local_e4c;
                local_348 = local_e1c;
                local_380 = local_e28;
                local_384 = local_e10;
                local_388 = local_e14;
                local_38c = local_e18;
                local_390 = local_e1c;
                *(undefined8 *)
                 (*local_e28 +
                 ((long)(local_e10 - (int)local_e28[4]) +
                  (long)(local_e14 - *(int *)((long)local_e28 + 0x24)) * local_e28[1] +
                  (long)(local_e18 - (int)local_e28[5]) * local_e28[2] +
                 (long)local_e1c * local_e28[3]) * 8) =
                     *(undefined8 *)
                      (*local_e30 +
                      ((long)(local_e48 - (int)local_e30[4]) +
                       (long)(local_e44 - *(int *)((long)local_e30 + 0x24)) * local_e30[1] +
                       (long)(local_e4c - (int)local_e30[5]) * local_e30[2] +
                      (long)local_e1c * local_e30[3]) * 8);
              }
LAB_01324036:
              local_1644._4_4_ = iVar9;
              iStack_1648 = iVar23;
              local_1660._4_4_ = iVar10;
              iStack_1664 = iVar8;
              local_167c._4_4_ = iVar19;
              iStack_1680 = iVar17;
              local_1644 = uVar7;
              _local_164c = _iVar22;
              local_1660 = uVar5;
              _local_1668 = _iVar21;
              local_167c = uVar2;
              _local_1684 = iVar18;
              iVar9 = local_1644._4_4_;
              iVar23 = iStack_1648;
              iVar19 = local_1660._4_4_;
              iVar17 = iStack_1664;
              local_1760 = local_167c._4_4_;
              local_ee4 = iStack_1680;
            }
          }
        }
        local_171c = local_171c + 1;
      } while( true );
    }
    for (local_16d0 = iStack_1694; local_1644._4_4_ = iVar9, iStack_1648 = iVar23,
        local_1660._4_4_ = local_1710, iStack_1664 = local_ebc, local_167c._4_4_ = iVar19,
        iStack_1680 = iVar17, iVar22 = local_1644._4_4_, iVar21 = iStack_1648,
        iVar18 = local_1660._4_4_, iVar10 = iStack_1664, iVar8 = local_167c._4_4_,
        iVar9 = iStack_1680, local_16d0 <= local_16b4._4_4_; local_16d0 = local_16d0 + 1) {
      for (local_16d4 = local_1698; local_1644._4_4_ = iVar22, iStack_1648 = iVar21,
          local_1660._4_4_ = iVar18, iStack_1664 = iVar10, local_167c._4_4_ = iVar8,
          iStack_1680 = iVar9, iVar9 = local_1644._4_4_, iVar23 = iStack_1648,
          local_1710 = local_1660._4_4_, local_ebc = iStack_1664, iVar19 = local_167c._4_4_,
          iVar17 = iStack_1680, local_16d4 <= (int)local_16b4; local_16d4 = local_16d4 + 1) {
        for (local_16d8 = 0; local_1644._4_4_ = iVar9, iStack_1648 = iVar23,
            local_1660._4_4_ = local_1710, iStack_1664 = local_ebc, local_167c._4_4_ = iVar19,
            iStack_1680 = iVar17, iVar22 = local_1644._4_4_, iVar21 = iStack_1648,
            iVar18 = local_1660._4_4_, iVar10 = iStack_1664, iVar8 = local_167c._4_4_,
            iVar9 = iStack_1680, local_16d8 < local_1320; local_16d8 = local_16d8 + 1) {
          local_11a0 = local_14b0;
          local_11a4 = 0;
          local_1210 = &local_13f0;
          local_1214 = 0;
          local_1110 = local_1570;
          local_1114 = 0;
          local_e50 = local_16d4;
          local_e54 = local_16d0;
          local_e58 = local_16cc;
          local_e5c = local_16d8;
          local_e80 = in_stack_00000010;
          local_b50 = in_stack_00000010;
          local_b54 = 0;
          local_880 = *in_stack_00000010;
          local_87c = local_16d4;
          if (local_880 == 1) {
            local_878 = local_16d4;
          }
          else if (local_880 == 2) {
            if (local_16d4 < 0) {
              iVar17 = local_16d4 + 1;
              if (iVar17 < 1) {
                iVar17 = -iVar17;
              }
              local_1910 = -iVar17 / 2 + -1;
            }
            else {
              local_1910 = local_16d4 / 2;
            }
            local_878 = local_1910;
          }
          else if (local_880 == 4) {
            if (local_16d4 < 0) {
              iVar17 = local_16d4 + 1;
              if (iVar17 < 1) {
                iVar17 = -iVar17;
              }
              local_1914 = -iVar17 / 4 + -1;
            }
            else {
              local_1914 = local_16d4 / 4;
            }
            local_878 = local_1914;
          }
          else {
            if (local_16d4 < 0) {
              iVar17 = local_16d4 + 1;
              if (iVar17 < 1) {
                iVar17 = -iVar17;
              }
              local_1918 = -iVar17 / local_880 + -1;
            }
            else {
              local_1918 = local_16d4 / local_880;
            }
            local_878 = local_1918;
          }
          local_e84 = local_878;
          local_b60 = in_stack_00000010;
          local_b64 = 0;
          iVar17 = _local_1684;
          uVar2 = local_167c;
          iVar19 = _local_1668;
          uVar5 = local_1660;
          _iVar23 = _local_164c;
          uVar7 = local_1644;
          local_e78 = local_1110;
          local_e70 = local_1210;
          local_e68 = local_11a0;
          if (local_878 * *in_stack_00000010 == local_16d4) {
            local_b70 = in_stack_00000010;
            local_b74 = 1;
            local_88c = in_stack_00000010[1];
            local_888 = local_16d0;
            if (local_88c == 1) {
              local_884 = local_16d0;
            }
            else if (local_88c == 2) {
              if (local_16d0 < 0) {
                iVar17 = local_16d0 + 1;
                if (iVar17 < 1) {
                  iVar17 = -iVar17;
                }
                local_1920 = -iVar17 / 2 + -1;
              }
              else {
                local_1920 = local_16d0 / 2;
              }
              local_884 = local_1920;
            }
            else if (local_88c == 4) {
              if (local_16d0 < 0) {
                iVar17 = local_16d0 + 1;
                if (iVar17 < 1) {
                  iVar17 = -iVar17;
                }
                local_1924 = -iVar17 / 4 + -1;
              }
              else {
                local_1924 = local_16d0 / 4;
              }
              local_884 = local_1924;
            }
            else {
              if (local_16d0 < 0) {
                iVar17 = local_16d0 + 1;
                if (iVar17 < 1) {
                  iVar17 = -iVar17;
                }
                local_1928 = -iVar17 / local_88c + -1;
              }
              else {
                local_1928 = local_16d0 / local_88c;
              }
              local_884 = local_1928;
            }
            local_e88 = local_884;
            local_b80 = in_stack_00000010;
            local_b84 = 2;
            local_898 = in_stack_00000010[2];
            local_894 = local_16cc;
            if (local_898 == 1) {
              local_890 = local_16cc;
            }
            else if (local_898 == 2) {
              if (local_16cc < 0) {
                iVar17 = local_16cc + 1;
                if (iVar17 < 1) {
                  iVar17 = -iVar17;
                }
                local_1930 = -iVar17 / 2 + -1;
              }
              else {
                local_1930 = local_16cc / 2;
              }
              local_890 = local_1930;
            }
            else if (local_898 == 4) {
              if (local_16cc < 0) {
                iVar17 = local_16cc + 1;
                if (iVar17 < 1) {
                  iVar17 = -iVar17;
                }
                local_1934 = -iVar17 / 4 + -1;
              }
              else {
                local_1934 = local_16cc / 4;
              }
              local_890 = local_1934;
            }
            else {
              if (local_16cc < 0) {
                iVar17 = local_16cc + 1;
                if (iVar17 < 1) {
                  iVar17 = -iVar17;
                }
                local_1938 = -iVar17 / local_898 + -1;
              }
              else {
                local_1938 = local_16cc / local_898;
              }
              local_890 = local_1938;
            }
            local_e8c = local_890;
            iVar17 = _local_1684;
            iStack_1680 = iVar9;
            local_167c._4_4_ = iVar8;
            iStack_1664 = iVar10;
            local_1660._4_4_ = iVar18;
            iStack_1648 = iVar21;
            local_1644._4_4_ = iVar22;
            bVar11 = Array4::operator_cast_to_bool(local_1110);
            uVar7 = local_1644;
            _iVar23 = _local_164c;
            uVar5 = local_1660;
            iVar19 = _local_1668;
            uVar2 = local_167c;
            iVar17 = _local_1684;
            iVar9 = iStack_1680;
            iVar8 = local_167c._4_4_;
            iVar10 = iStack_1664;
            iVar18 = local_1660._4_4_;
            iVar21 = iStack_1648;
            iVar22 = local_1644._4_4_;
            if (bVar11) {
              local_8 = local_e78;
              local_c = local_e84;
              local_10 = local_e88;
              local_14 = local_e8c;
              local_18 = local_e5c;
              if (*(int *)(*(long *)local_e78 +
                          ((long)(local_e84 - *(int *)(local_e78 + 0x20)) +
                           (long)(local_e88 - *(int *)(local_e78 + 0x24)) * *(long *)(local_e78 + 8)
                           + (long)(local_e8c - *(int *)(local_e78 + 0x28)) *
                             *(long *)(local_e78 + 0x10) +
                          (long)local_e5c * *(long *)(local_e78 + 0x18)) * 4) == 0)
              goto LAB_01323516;
            }
            local_320 = local_e70;
            local_324 = local_e84;
            local_328 = local_e88;
            local_32c = local_e8c;
            local_330 = local_e5c;
            local_368 = local_e68;
            local_36c = local_e50;
            local_370 = local_e54;
            local_374 = local_e58;
            local_378 = local_e5c;
            *(undefined8 *)
             (*local_e68 +
             ((long)(local_e50 - (int)local_e68[4]) +
              (long)(local_e54 - *(int *)((long)local_e68 + 0x24)) * local_e68[1] +
              (long)(local_e58 - (int)local_e68[5]) * local_e68[2] + (long)local_e5c * local_e68[3])
             * 8) = *(undefined8 *)
                     (*local_e70 +
                     ((long)(local_e84 - (int)local_e70[4]) +
                      (long)(local_e88 - *(int *)((long)local_e70 + 0x24)) * local_e70[1] +
                      (long)(local_e8c - (int)local_e70[5]) * local_e70[2] +
                     (long)local_e5c * local_e70[3]) * 8);
          }
LAB_01323516:
          local_1644._4_4_ = iVar22;
          iStack_1648 = iVar21;
          local_1660._4_4_ = iVar18;
          iStack_1664 = iVar10;
          local_167c._4_4_ = iVar8;
          iStack_1680 = iVar9;
          local_1644 = uVar7;
          _local_164c = _iVar23;
          local_1660 = uVar5;
          _local_1668 = iVar19;
          local_167c = uVar2;
          _local_1684 = iVar17;
          iVar9 = local_1644._4_4_;
          iVar23 = iStack_1648;
          local_1710 = local_1660._4_4_;
          local_ebc = iStack_1664;
          iVar19 = local_167c._4_4_;
          iVar17 = iStack_1680;
        }
      }
    }
    local_16cc = local_16cc + 1;
    iVar17 = _local_1684;
    uVar2 = local_167c;
    iVar19 = _local_1668;
    uVar5 = local_1660;
    _iVar23 = _local_164c;
    uVar7 = local_1644;
    iStack_1680 = iVar9;
    local_167c._4_4_ = iVar8;
    iStack_1664 = iVar10;
    local_1660._4_4_ = iVar18;
    iStack_1648 = iVar21;
    local_1644._4_4_ = iVar22;
  } while( true );
}

Assistant:

void FaceLinear::interp_arr (Array<FArrayBox*, AMREX_SPACEDIM> const& crse,
                             const int         crse_comp,
                             Array<FArrayBox*, AMREX_SPACEDIM> const& fine,
                             const int         fine_comp,
                             const int         ncomp,
                             const Box&        fine_region,
                             const IntVect&    ratio,
                             Array<IArrayBox*, AMREX_SPACEDIM> const& solve_mask,
                             const Geometry&   /*crse_geom*/,
                             const Geometry&   /*fine_geom*/,
                             Vector<Array<BCRec, AMREX_SPACEDIM> > const& /*bcr*/,
                             const int         /*actual_comp*/,
                             const int         /*actual_state*/,
                             const RunOn       runon)
{
    BL_PROFILE("FaceLinear::interp_arr()");

    Array<IndexType, AMREX_SPACEDIM> types;
    for (int d=0; d<AMREX_SPACEDIM; ++d)
        { types[d].set(d); }

    GpuArray<Array4<const Real>, AMREX_SPACEDIM> crse_arr;
    GpuArray<Array4<Real>, AMREX_SPACEDIM> fine_arr;
    GpuArray<Array4<const int>, AMREX_SPACEDIM> mask_arr;
    for (int d=0; d<AMREX_SPACEDIM; ++d)
    {
        crse_arr[d] = crse[d]->const_array(crse_comp);
        fine_arr[d] = fine[d]->array(fine_comp);
        if (solve_mask[d] != nullptr)
            { mask_arr[d] = solve_mask[d]->const_array(0); }
    }

    //
    // Fill fine ghost faces with piecewise-constant interpolation of coarse data.
    // Operate only on faces that overlap--ie, only fill the fine faces that make up each
    // coarse face, leave the in-between faces alone.
    // The mask ensures we do not overwrite valid fine cells.
    //
    // Fuse the launches, 1 for each dimension, into a single launch.
    AMREX_LAUNCH_HOST_DEVICE_LAMBDA_DIM_FLAG(runon,
              amrex::convert(fine_region,types[0]), bx0,
              {
                  AMREX_LOOP_3D(bx0, i, j, k,
                  {
                      for (int n=0; n<ncomp; ++n)
                      {
                          face_linear_face_interp_x(i,j,k,n,fine_arr[0],crse_arr[0],mask_arr[0],ratio);
                      }
                  });
              },
              amrex::convert(fine_region,types[1]), bx1,
              {
                  AMREX_LOOP_3D(bx1, i, j, k,
                  {
                      for (int n=0; n<ncomp; ++n)
                      {
                          face_linear_face_interp_y(i,j,k,n,fine_arr[1],crse_arr[1],mask_arr[1],ratio);
                      }
                  });
              },
              amrex::convert(fine_region,types[2]), bx2,
              {
                  AMREX_LOOP_3D(bx2, i, j, k,
                  {
                      for (int n=0; n<ncomp; ++n)
                      {
                          face_linear_face_interp_z(i,j,k,n,fine_arr[2],crse_arr[2],mask_arr[2],ratio);
                      }
                  });
              });

    //
    // Interpolate unfilled grow cells using best data from
    // surrounding faces of valid region, and pc-interpd data
    // on fine faces overlaying coarse edges.
    //
    AMREX_LAUNCH_HOST_DEVICE_LAMBDA_DIM_FLAG(runon,
              amrex::convert(fine_region,types[0]), bx0,
              {
                  AMREX_LOOP_3D(bx0, i, j, k,
                  {
                      for (int n=0; n<ncomp; ++n)
                      {
                          face_linear_interp_x(i,j,k,n,fine_arr[0],ratio);
                      }
                  });
              },
              amrex::convert(fine_region,types[1]), bx1,
              {
                  AMREX_LOOP_3D(bx1, i, j, k,
                  {
                      for (int n=0; n<ncomp; ++n)
                      {
                          face_linear_interp_y(i,j,k,n,fine_arr[1],ratio);
                      }
                  });
              },
              amrex::convert(fine_region,types[2]), bx2,
              {
                  AMREX_LOOP_3D(bx2, i, j, k,
                  {
                      for (int n=0; n<ncomp; ++n)
                      {
                          face_linear_interp_z(i,j,k,n,fine_arr[2],ratio);
                      }
                  });
              });
}